

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall
ON_MeshFace::IsPlanar
          (ON_MeshFace *this,double planar_tolerance,double angle_tolerance_radians,
          ON_3dPointListRef *vertex_list,ON_PlaneEquation *face_plane_equation)

{
  ON_3dPoint P;
  double dVar1;
  bool bVar2;
  double dVar3;
  double local_120;
  uint local_10c;
  uint i_1;
  double cos_atol;
  double unset_x;
  ON_3dVector corner_normals [4];
  ON_3dPoint local_90;
  int local_74;
  double dStack_70;
  int i;
  double h;
  double h1;
  double h0;
  ON_PlaneEquation e;
  ON_PlaneEquation *face_plane_equation_local;
  ON_3dPointListRef *vertex_list_local;
  double angle_tolerance_radians_local;
  double planar_tolerance_local;
  ON_MeshFace *this_local;
  
  e.d = (double)face_plane_equation;
  ON_PlaneEquation::ON_PlaneEquation((ON_PlaneEquation *)&h0);
  bVar2 = GetPlaneEquation(this,vertex_list,(ON_PlaneEquation *)&h0);
  if (bVar2) {
    if (e.d != 0.0) {
      *(double *)e.d = h0;
      *(double *)((long)e.d + 8) = e.x;
      *(double *)((long)e.d + 0x10) = e.y;
      *(double *)((long)e.d + 0x18) = e.z;
    }
    if (this->vi[2] == this->vi[3]) {
      this_local._7_1_ = true;
    }
    else {
      if (0.0 <= planar_tolerance) {
        h = 0.0;
        h1 = 0.0;
        for (local_74 = 1; local_74 < 3; local_74 = local_74 + 1) {
          if (this->vi[local_74 + -1] != this->vi[local_74]) {
            ON_3dPointListRef::operator[](&local_90,vertex_list,this->vi[local_74]);
            P.y = local_90.y;
            P.x = local_90.x;
            P.z = local_90.z;
            dStack_70 = ON_PlaneEquation::ValueAt((ON_PlaneEquation *)&h0,P);
            dVar1 = h;
            dVar3 = dStack_70;
            if (((dStack_70 < h1) || (dVar1 = dStack_70, dVar3 = h1, h < dStack_70)) &&
               (h1 = dVar3, h = dVar1, planar_tolerance < h - h1)) {
              return false;
            }
          }
        }
      }
      if (0.0 <= angle_tolerance_radians) {
        GetCornerNormals(this,vertex_list,(ON_3dVector *)&unset_x);
        dVar1 = ON_3dVector::UnsetVector.x;
        if (3.141592653589793 <= angle_tolerance_radians) {
          local_120 = -1.0;
        }
        else {
          local_120 = cos(angle_tolerance_radians);
        }
        for (local_10c = 0; local_10c < 2; local_10c = local_10c + 1) {
          if ((((dVar1 != corner_normals[(ulong)local_10c - 1].z) ||
               (NAN(dVar1) || NAN(corner_normals[(ulong)local_10c - 1].z))) &&
              ((dVar1 != corner_normals[(ulong)(local_10c + 2) - 1].z ||
               (NAN(dVar1) || NAN(corner_normals[(ulong)(local_10c + 2) - 1].z))))) &&
             (dVar3 = ON_3dVector::operator*
                                ((ON_3dVector *)&corner_normals[(ulong)local_10c - 1].z,
                                 (ON_3dVector *)&corner_normals[(ulong)(local_10c + 2) - 1].z),
             dVar3 < local_120)) {
            return false;
          }
        }
      }
      this_local._7_1_ = true;
    }
  }
  else {
    if (e.d != 0.0) {
      *(double *)e.d = ON_PlaneEquation::UnsetPlaneEquation.x;
      *(double *)((long)e.d + 8) = ON_PlaneEquation::UnsetPlaneEquation.y;
      *(double *)((long)e.d + 0x10) = ON_PlaneEquation::UnsetPlaneEquation.z;
      *(double *)((long)e.d + 0x18) = ON_PlaneEquation::UnsetPlaneEquation.d;
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_MeshFace::IsPlanar( 
  double planar_tolerance,
  double angle_tolerance_radians,
  const class ON_3dPointListRef& vertex_list, 
  ON_PlaneEquation* face_plane_equation
  ) const
{
  ON_PlaneEquation e;

  for (;;)
  {
    if (!GetPlaneEquation(vertex_list, e))
      break;

    if ( face_plane_equation )
      *face_plane_equation = e;

    if (vi[2] == vi[3])
      return true; // triangle

    if (planar_tolerance >= 0.0)
    {
      double h0, h1, h;
      h0 = h1 = 0.0;
      for (int i = 1; i < 3; i++)
      {
        if (vi[i - 1] == vi[i])
          continue;
        h = e.ValueAt(vertex_list[vi[i]]);
        if (h < h0)
          h0 = h;
        else if (h > h1)
          h1 = h;
        else
          continue;
        if (h1 - h0 > planar_tolerance)
        {
          return false;
        }
      }
    }

    if (angle_tolerance_radians >= 0.0)
    {
      ON_3dVector corner_normals[4];
      GetCornerNormals(vertex_list, corner_normals);
      const double unset_x = ON_3dVector::UnsetVector.x;
      const double cos_atol = (angle_tolerance_radians < ON_PI) ? cos(angle_tolerance_radians) : -1.0;
      for (unsigned int i = 0; i < 2; i++)
      {
        if (unset_x != corner_normals[i].x && unset_x != corner_normals[i+2].x && corner_normals[i] * corner_normals[i+2] < cos_atol)
          return false;
      }
    }

    return true;
  }

  if (face_plane_equation)
    *face_plane_equation = ON_PlaneEquation::UnsetPlaneEquation;

  return false;
}